

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::RoundDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference input_00;
  undefined7 in_register_00000031;
  ulong uVar1;
  hugeint_t addition;
  hugeint_t local_58;
  hugeint_t local_48;
  undefined1 local_38 [16];
  
  uVar1 = (ulong)(uint)((int)CONCAT71(in_register_00000031,scale) << 4);
  local_48.lower = *(uint64_t *)((long)&Hugeint::POWERS_OF_TEN + uVar1);
  local_48.upper = *(int64_t *)(duckdb::hugeint_t::operator&= + uVar1);
  duckdb::hugeint_t::hugeint_t(&local_58,2);
  local_38 = duckdb::hugeint_t::operator/(&local_48,&local_58);
  input_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  local_58.lower = (uint64_t)local_38;
  local_58.upper = (int64_t)&local_48;
  UnaryExecutor::
  ExecuteStandard<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryLambdaWrapper,duckdb::RoundDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
            (input_00,result,*(idx_t *)(input + 0x18),&local_58,false,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}